

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TFunction * __thiscall
glslang::TParseContext::findFunction120
          (TParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn)

{
  TSymbolTable *pTVar1;
  TFunction *pTVar2;
  TType *pTVar3;
  TIntermediate *pTVar4;
  TFunction *pTVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  TBasicType TVar10;
  TBasicType TVar11;
  undefined4 extraout_var;
  TSymbol *pTVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference ppTVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar14;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TQualifier *pTVar15;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  char *pcVar16;
  uint local_80;
  int i;
  bool possibleMatch;
  TFunction *function;
  __normal_iterator<const_glslang::TFunction_**,_std::vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>_>
  local_68;
  iterator it;
  TVector<const_glslang::TFunction_*> candidateList;
  TFunction *candidate;
  TSymbol *symbol;
  bool *builtIn_local;
  TFunction *call_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[6])();
  pTVar12 = TSymbolTable::find(pTVar1,(TString *)CONCAT44(extraout_var,iVar8),builtIn,(bool *)0x0,
                               (int *)0x0);
  if (pTVar12 == (TSymbol *)0x0) {
    candidateList.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    TVector<const_glslang::TFunction_*>::TVector((TVector<const_glslang::TFunction_*> *)&it);
    pTVar1 = (this->super_TParseContextBase).symbolTable;
    iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[6])();
    TSymbolTable::findFunctionNameList
              (pTVar1,(TString *)CONCAT44(extraout_var_01,iVar8),
               (TVector<const_glslang::TFunction_*> *)&it,builtIn);
    local_68._M_current =
         (TFunction **)
         std::
         vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>::
         begin((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                *)&it);
    while( true ) {
      function = (TFunction *)
                 std::
                 vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                 ::end((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                        *)&it);
      bVar6 = __gnu_cxx::operator!=
                        (&local_68,
                         (__normal_iterator<const_glslang::TFunction_**,_std::vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>_>
                          *)&function);
      if (!bVar6) break;
      ppTVar13 = __gnu_cxx::
                 __normal_iterator<const_glslang::TFunction_**,_std::vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>_>
                 ::operator*(&local_68);
      pTVar2 = *ppTVar13;
      iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x24])();
      iVar9 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x24])();
      pTVar5 = (TFunction *)
               candidateList.
               super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
               .
               super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar8 == iVar9) {
        bVar6 = true;
        for (local_80 = 0; iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x24])(),
            (int)local_80 < iVar8; local_80 = local_80 + 1) {
          iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)local_80);
          pTVar3 = *(TType **)(CONCAT44(extraout_var_02,iVar8) + 8);
          iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)local_80);
          bVar7 = TType::operator==(pTVar3,*(TType **)(CONCAT44(extraout_var_03,iVar8) + 8));
          if (!bVar7) {
            iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)local_80);
            uVar14 = (**(code **)(**(long **)(CONCAT44(extraout_var_04,iVar8) + 8) + 0xe8))();
            if ((uVar14 & 1) == 0) {
              iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)local_80);
              uVar14 = (**(code **)(**(long **)(CONCAT44(extraout_var_05,iVar8) + 8) + 0xe8))();
              if ((uVar14 & 1) != 0) goto LAB_007701a8;
              iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)local_80);
              pTVar3 = *(TType **)(CONCAT44(extraout_var_06,iVar8) + 8);
              iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)local_80);
              bVar7 = TType::sameElementShape
                                (pTVar3,*(TType **)(CONCAT44(extraout_var_07,iVar8) + 8),(int *)0x0,
                                 (int *)0x0);
              if (!bVar7) goto LAB_007701a8;
              iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)local_80);
              pTVar15 = (TQualifier *)
                        (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar8) + 8) + 0x50))();
              bVar7 = TQualifier::isParamInput(pTVar15);
              if (bVar7) {
                pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)local_80);
                TVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar8) + 8) + 0x38))();
                iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)local_80);
                TVar11 = (**(code **)(**(long **)(CONCAT44(extraout_var_10,iVar8) + 8) + 0x38))();
                bVar7 = TIntermediate::canImplicitlyPromote(pTVar4,TVar10,TVar11,EOpNull);
                if (!bVar7) {
                  bVar6 = false;
                }
              }
              iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)local_80);
              pTVar15 = (TQualifier *)
                        (**(code **)(**(long **)(CONCAT44(extraout_var_11,iVar8) + 8) + 0x50))();
              bVar7 = TQualifier::isParamOutput(pTVar15);
              if (bVar7) {
                pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)local_80);
                TVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_12,iVar8) + 8) + 0x38))();
                iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)local_80);
                TVar11 = (**(code **)(**(long **)(CONCAT44(extraout_var_13,iVar8) + 8) + 0x38))();
                bVar7 = TIntermediate::canImplicitlyPromote(pTVar4,TVar10,TVar11,EOpNull);
                if (!bVar7) {
                  bVar6 = false;
                }
              }
            }
            else {
LAB_007701a8:
              bVar6 = false;
            }
            if (!bVar6) break;
          }
        }
        if ((bVar6) &&
           (pTVar5 = pTVar2,
           candidateList.
           super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
           .
           super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
          iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[3])();
          pcVar16 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_14,iVar8));
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,
                     "ambiguous function signature match: multiple signatures match under implicit type conversion"
                     ,pcVar16,"");
          pTVar5 = (TFunction *)
                   candidateList.
                   super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   .
                   super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
      }
      candidateList.
      super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      .
      super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pTVar5;
      __gnu_cxx::
      __normal_iterator<const_glslang::TFunction_**,_std::vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>_>
      ::operator++(&local_68);
    }
    if (candidateList.
        super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
        .
        super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[3])();
      pcVar16 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_15,iVar8));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"no matching overloaded function found",pcVar16,"");
    }
    this_local = (TParseContext *)
                 candidateList.
                 super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                 .
                 super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    TVector<const_glslang::TFunction_*>::~TVector((TVector<const_glslang::TFunction_*> *)&it);
  }
  else {
    iVar8 = (*pTVar12->_vptr_TSymbol[7])();
    this_local = (TParseContext *)CONCAT44(extraout_var_00,iVar8);
  }
  return (TFunction *)this_local;
}

Assistant:

const TFunction* TParseContext::findFunction120(const TSourceLoc& loc, const TFunction& call, bool& builtIn)
{
    // first, look for an exact match
    TSymbol* symbol = symbolTable.find(call.getMangledName(), &builtIn);
    if (symbol)
        return symbol->getAsFunction();

    // exact match not found, look through a list of overloaded functions of the same name

    // "If no exact match is found, then [implicit conversions] will be applied to find a match. Mismatched types
    // on input parameters (in or inout or default) must have a conversion from the calling argument type to the
    // formal parameter type. Mismatched types on output parameters (out or inout) must have a conversion
    // from the formal parameter type to the calling argument type.  When argument conversions are used to find
    // a match, it is a semantic error if there are multiple ways to apply these conversions to make the call match
    // more than one function."

    const TFunction* candidate = nullptr;
    TVector<const TFunction*> candidateList;
    symbolTable.findFunctionNameList(call.getMangledName(), candidateList, builtIn);

    for (auto it = candidateList.begin(); it != candidateList.end(); ++it) {
        const TFunction& function = *(*it);

        // to even be a potential match, number of arguments has to match
        if (call.getParamCount() != function.getParamCount())
            continue;

        bool possibleMatch = true;
        for (int i = 0; i < function.getParamCount(); ++i) {
            // same types is easy
            if (*function[i].type == *call[i].type)
                continue;

            // We have a mismatch in type, see if it is implicitly convertible

            if (function[i].type->isArray() || call[i].type->isArray() ||
                ! function[i].type->sameElementShape(*call[i].type))
                possibleMatch = false;
            else {
                // do direction-specific checks for conversion of basic type
                if (function[i].type->getQualifier().isParamInput()) {
                    if (! intermediate.canImplicitlyPromote(call[i].type->getBasicType(), function[i].type->getBasicType()))
                        possibleMatch = false;
                }
                if (function[i].type->getQualifier().isParamOutput()) {
                    if (! intermediate.canImplicitlyPromote(function[i].type->getBasicType(), call[i].type->getBasicType()))
                        possibleMatch = false;
                }
            }
            if (! possibleMatch)
                break;
        }
        if (possibleMatch) {
            if (candidate) {
                // our second match, meaning ambiguity
                error(loc, "ambiguous function signature match: multiple signatures match under implicit type conversion", call.getName().c_str(), "");
            } else
                candidate = &function;
        }
    }

    if (candidate == nullptr)
        error(loc, "no matching overloaded function found", call.getName().c_str(), "");

    return candidate;
}